

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  Colour colour;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam000000000018c5b0 = 0x7e7e7e7e7e7e7e;
    uRam000000000018c5b7._0_1_ = '~';
    uRam000000000018c5b7._1_1_ = '~';
    uRam000000000018c5b7._2_1_ = '~';
    uRam000000000018c5b7._3_1_ = '~';
    uRam000000000018c5b7._4_1_ = '~';
    uRam000000000018c5b7._5_1_ = '~';
    uRam000000000018c5b7._6_1_ = '~';
    uRam000000000018c5b7._7_1_ = '~';
    DAT_0018c5a0 = '~';
    DAT_0018c5a0_1._0_1_ = '~';
    DAT_0018c5a0_1._1_1_ = '~';
    DAT_0018c5a0_1._2_1_ = '~';
    DAT_0018c5a0_1._3_1_ = '~';
    DAT_0018c5a0_1._4_1_ = '~';
    DAT_0018c5a0_1._5_1_ = '~';
    DAT_0018c5a0_1._6_1_ = '~';
    uRam000000000018c5a8 = 0x7e7e7e7e7e7e7e;
    DAT_0018c5af = 0x7e;
    DAT_0018c590 = '~';
    DAT_0018c590_1._0_1_ = '~';
    DAT_0018c590_1._1_1_ = '~';
    DAT_0018c590_1._2_1_ = '~';
    DAT_0018c590_1._3_1_ = '~';
    DAT_0018c590_1._4_1_ = '~';
    DAT_0018c590_1._5_1_ = '~';
    DAT_0018c590_1._6_1_ = '~';
    uRam000000000018c598._0_1_ = '~';
    uRam000000000018c598._1_1_ = '~';
    uRam000000000018c598._2_1_ = '~';
    uRam000000000018c598._3_1_ = '~';
    uRam000000000018c598._4_1_ = '~';
    uRam000000000018c598._5_1_ = '~';
    uRam000000000018c598._6_1_ = '~';
    uRam000000000018c598._7_1_ = '~';
    DAT_0018c580 = '~';
    DAT_0018c580_1._0_1_ = '~';
    DAT_0018c580_1._1_1_ = '~';
    DAT_0018c580_1._2_1_ = '~';
    DAT_0018c580_1._3_1_ = '~';
    DAT_0018c580_1._4_1_ = '~';
    DAT_0018c580_1._5_1_ = '~';
    DAT_0018c580_1._6_1_ = '~';
    uRam000000000018c588._0_1_ = '~';
    uRam000000000018c588._1_1_ = '~';
    uRam000000000018c588._2_1_ = '~';
    uRam000000000018c588._3_1_ = '~';
    uRam000000000018c588._4_1_ = '~';
    uRam000000000018c588._5_1_ = '~';
    uRam000000000018c588._6_1_ = '~';
    uRam000000000018c588._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam000000000018c578._0_1_ = '~';
    uRam000000000018c578._1_1_ = '~';
    uRam000000000018c578._2_1_ = '~';
    uRam000000000018c578._3_1_ = '~';
    uRam000000000018c578._4_1_ = '~';
    uRam000000000018c578._5_1_ = '~';
    uRam000000000018c578._6_1_ = '~';
    uRam000000000018c578._7_1_ = '~';
    DAT_0018c5bf = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,"\n");
  colour.m_moved = false;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," b");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  __lhs = DAT_0018c4f8;
  std::__cxx11::string::string((string *)&local_38,"master",&local_39);
  bVar1 = std::operator!=(__lhs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar2 = std::operator<<(poVar2,DAT_0018c4f8);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            currentTestRunInfo.used = true;
        }